

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

ProgressInfo __thiscall Quest_Context::Progress(Quest_Context *this)

{
  Character *this_00;
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  bool bVar4;
  int iVar5;
  ProgressInfo PVar6;
  int *piVar7;
  size_type sVar8;
  const_reference pvVar9;
  ulong uVar10;
  pointer ppVar11;
  short local_198;
  short local_18c;
  short local_180;
  _Self local_138;
  _Self local_130;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_64;
  int local_60 [4];
  Rule *local_50;
  Rule *goal;
  undefined1 local_40 [4];
  short goal_goal;
  short goal_progress;
  string goal_progress_key;
  BookIcon icon;
  Quest_Context *this_local;
  
  goal_progress_key.field_2._14_2_ = 5;
  std::__cxx11::string::string((string *)local_40);
  goal._6_2_ = 0;
  goal._4_2_ = 0;
  local_50 = EOPlus::Context::GetGoal(&this->super_Context);
  if (local_50 != (Rule *)0x0) {
    bVar4 = std::operator==(&(local_50->expr).function,"gotitems");
    if ((bVar4) || (bVar4 = std::operator==(&(local_50->expr).function,"gotspell"), bVar4)) {
      goal_progress_key.field_2._14_2_ = 3;
      pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                         (&(local_50->expr).args,1);
      local_60[0] = util::variant::operator_cast_to_int(pvVar9);
      this_00 = this->character;
      pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                         (&(local_50->expr).args,0);
      iVar5 = util::variant::operator_cast_to_int(pvVar9);
      local_64 = Character::HasItem(this_00,(short)iVar5,false);
      piVar7 = std::min<int>(local_60,&local_64);
      goal._6_2_ = (short)*piVar7;
      sVar8 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                        (&(local_50->expr).args);
      if (sVar8 < 2) {
        local_180 = 1;
      }
      else {
        pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                           (&(local_50->expr).args,1);
        iVar5 = util::variant::operator_cast_to_int(pvVar9);
        local_180 = (short)iVar5;
      }
      goal._4_2_ = local_180;
    }
    else {
      bVar4 = std::operator==(&(local_50->expr).function,"useditem");
      if ((bVar4) || (bVar4 = std::operator==(&(local_50->expr).function,"usedspell"), bVar4)) {
        goal_progress_key.field_2._14_2_ = 3;
        std::operator+(&local_a8,&(local_50->expr).function,"/");
        pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                           (&(local_50->expr).args,0);
        util::variant::operator_cast_to_string(&local_c8,pvVar9);
        std::operator+(&local_88,&local_a8,&local_c8);
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        sVar8 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                          (&(local_50->expr).args);
        if (sVar8 < 2) {
          local_18c = 1;
        }
        else {
          pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                             (&(local_50->expr).args,1);
          iVar5 = util::variant::operator_cast_to_int(pvVar9);
          local_18c = (short)iVar5;
        }
        goal._4_2_ = local_18c;
      }
      else {
        bVar4 = std::operator==(&(local_50->expr).function,"killednpcs");
        if (bVar4) {
          goal_progress_key.field_2._14_2_ = 8;
          std::operator+(&local_108,&(local_50->expr).function,"/");
          pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                             (&(local_50->expr).args,0);
          util::variant::operator_cast_to_string((string *)&it,pvVar9);
          std::operator+(&local_e8,&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
          std::__cxx11::string::operator=((string *)local_40,(string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&it);
          std::__cxx11::string::~string((string *)&local_108);
          sVar8 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                            (&(local_50->expr).args);
          if (sVar8 < 2) {
            local_198 = 1;
          }
          else {
            pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                               (&(local_50->expr).args,1);
            iVar5 = util::variant::operator_cast_to_int(pvVar9);
            local_198 = (short)iVar5;
          }
          goal._4_2_ = local_198;
        }
        else {
          bVar4 = std::operator==(&(local_50->expr).function,"killedplayers");
          if (bVar4) {
            goal_progress_key.field_2._14_2_ = 8;
            std::__cxx11::string::operator=((string *)local_40,(string *)&(local_50->expr).function)
            ;
            pvVar9 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                               (&(local_50->expr).args,0);
            iVar5 = util::variant::operator_cast_to_int(pvVar9);
            goal._4_2_ = (short)iVar5;
          }
          else {
            bVar4 = std::operator==(&(local_50->expr).function,"entercoord");
            if ((((bVar4) ||
                 (bVar4 = std::operator==(&(local_50->expr).function,"leavecoord"), bVar4)) ||
                (bVar4 = std::operator==(&(local_50->expr).function,"entermap"), bVar4)) ||
               (bVar4 = std::operator==(&(local_50->expr).function,"leavemap"), bVar4)) {
              goal_progress_key.field_2._14_2_ = 10;
            }
          }
        }
      }
    }
  }
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    local_130._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
         ::find(&this->progress,(key_type *)local_40);
    local_138._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
         ::end(&this->progress);
    bVar4 = std::operator!=(&local_130,&local_138);
    if (bVar4) {
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
                ::operator->(&local_130);
      goal._6_2_ = ppVar11->second;
    }
  }
  uVar3 = goal_progress_key.field_2._14_2_;
  sVar2 = goal._6_2_;
  sVar1 = goal._4_2_;
  std::__cxx11::string::~string((string *)local_40);
  PVar6.target = sVar1;
  PVar6.icon = uVar3;
  PVar6.progress = sVar2;
  return PVar6;
}

Assistant:

Quest_Context::ProgressInfo Quest_Context::Progress() const
{
	BookIcon icon = BOOK_ICON_TALK;
	std::string goal_progress_key;
	short goal_progress = 0;
	short goal_goal = 0;

	const EOPlus::Rule* goal = this->GetGoal();

	if (goal)
	{
		if (goal->expr.function == "gotitems" || goal->expr.function == "gotspell")
		{
			icon = BOOK_ICON_ITEM;
			goal_progress = std::min<int>(goal->expr.args[1], this->character->HasItem(int(goal->expr.args[0])));
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "useditem" || goal->expr.function == "usedspell")
		{
			icon = BOOK_ICON_ITEM;
			goal_progress_key = goal->expr.function + "/" + std::string(goal->expr.args[0]);
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "killednpcs")
		{
			icon = BOOK_ICON_KILL;
			goal_progress_key = goal->expr.function + "/" + std::string(goal->expr.args[0]);
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "killedplayers")
		{
			icon = BOOK_ICON_KILL;
			goal_progress_key = goal->expr.function;
			goal_goal = int(goal->expr.args[0]);
		}
		else if (goal->expr.function == "entercoord" || goal->expr.function == "leavecoord" || goal->expr.function == "entermap" || goal->expr.function == "leavemap")
		{
			icon = BOOK_ICON_STEP;
		}
	}

	if (!goal_progress_key.empty())
	{
		auto it = this->progress.find(goal_progress_key);

		if (it != this->progress.end())
			goal_progress = it->second;
	}

	return ProgressInfo{icon, goal_progress, goal_goal};
}